

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)

{
  int iVar1;
  uchar *buf;
  uchar *zBlock;
  uchar *puStack_48;
  int rc;
  uchar *zPrev;
  sxu16 nByte;
  sxu16 iBlksz;
  uchar *puStack_38;
  sxu16 iNext;
  uchar *zPtr;
  uchar *zEnd;
  sxu16 *pOfft_local;
  sxu64 nAmount_local;
  lhpage *pPage_local;
  
  if ((nAmount <= pPage->nFree) &&
     ((9 < pPage->nCell || ((int)nAmount < pPage->pHash->iPageSize / 2)))) {
    zPtr = pPage->pRaw->zData + pPage->pHash->iPageSize;
    zPrev._2_2_ = (ushort)nAmount;
    puStack_48 = (uchar *)0x0;
    zPrev._4_2_ = 0;
    puStack_38 = pPage->pRaw->zData + (pPage->sHdr).iFree;
    zEnd = (uchar *)pOfft;
    pOfft_local = (sxu16 *)nAmount;
    nAmount_local = (sxu64)pPage;
    while (puStack_38 < zPtr) {
      SyBigEndianUnpack16(puStack_38,(sxu16 *)((long)&zPrev + 6));
      SyBigEndianUnpack16(puStack_38 + 2,(sxu16 *)((long)&zPrev + 4));
      if (zPrev._2_2_ <= zPrev._4_2_) {
LAB_001192ae:
        iVar1 = (**(code **)(**(long **)nAmount_local + 0x28))(*(undefined8 *)(nAmount_local + 8));
        if (iVar1 == 0) {
          *(short *)zEnd = (short)puStack_38 - (short)**(undefined8 **)(nAmount_local + 8);
          if ((zPrev._2_2_ <= zPrev._4_2_) && (3 < (int)((uint)zPrev._4_2_ - (uint)zPrev._2_2_))) {
            buf = (uchar *)(**(long **)(nAmount_local + 8) +
                           (long)(int)((uint)*(ushort *)zEnd + (uint)zPrev._2_2_));
            puStack_38 = buf;
            SyBigEndianPack16(buf,zPrev._6_2_);
            SyBigEndianPack16(buf + 2,zPrev._4_2_ - zPrev._2_2_);
            zPrev._6_2_ = (short)puStack_38 - (short)**(undefined8 **)(nAmount_local + 8);
            zPrev._4_2_ = zPrev._2_2_;
          }
          if (puStack_48 == (uchar *)0x0) {
            *(sxu16 *)(nAmount_local + 0x12) = zPrev._6_2_;
            SyBigEndianPack16((uchar *)(**(long **)(nAmount_local + 8) + 2),zPrev._6_2_);
          }
          else {
            SyBigEndianPack16(puStack_48,zPrev._6_2_);
          }
          *(ushort *)(nAmount_local + 0x5c) = *(short *)(nAmount_local + 0x5c) - zPrev._4_2_;
          return 0;
        }
        return iVar1;
      }
      puStack_48 = puStack_38;
      if (zPrev._6_2_ == 0) {
        iVar1 = lhPageDefragment((lhpage *)nAmount_local);
        if ((iVar1 != 0) || (*(ushort *)(nAmount_local + 0x5c) < zPrev._2_2_)) {
          return -0x49;
        }
        zPrev._6_2_ = 0;
        puStack_38 = (uchar *)(**(long **)(nAmount_local + 8) +
                              (ulong)*(ushort *)(nAmount_local + 0x12));
        zPrev._4_2_ = *(ushort *)(nAmount_local + 0x5c);
        puStack_48 = (uchar *)0x0;
        goto LAB_001192ae;
      }
      puStack_38 = (uchar *)(**(long **)(nAmount_local + 8) + (ulong)zPrev._6_2_);
    }
  }
  return -0x49;
}

Assistant:

static int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)
{
	const unsigned char *zEnd,*zPtr;
	sxu16 iNext,iBlksz,nByte;
	unsigned char *zPrev;
	int rc;
	if( (sxu64)pPage->nFree < nAmount ){
		/* Don't bother looking for a free chunk */
		return UNQLITE_FULL;
	}
	if( pPage->nCell < 10 && ((int)nAmount >= (pPage->pHash->iPageSize / 2)) ){
		/* Big chunk need an overflow page for its data */
		return UNQLITE_FULL;
	}
	zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
	zEnd = &pPage->pRaw->zData[pPage->pHash->iPageSize];
	nByte = (sxu16)nAmount;
	zPrev = 0;
	iBlksz = 0; /* cc warning */
	/* Perform the lookup */
	for(;;){
		if( zPtr >= zEnd ){
			return UNQLITE_FULL;
		}
		/* Offset of the next free block */
		SyBigEndianUnpack16(zPtr,&iNext);
		/* Block size */
		SyBigEndianUnpack16(&zPtr[2],&iBlksz);
		if( iBlksz >= nByte ){
			/* Got one */
			break;
		}
		zPrev = (unsigned char *)zPtr;
		if( iNext == 0 ){
			/* No more free blocks, defragment the page */
			rc = lhPageDefragment(pPage);
			if( rc == UNQLITE_OK && pPage->nFree >= nByte) {
				/* Free blocks are merged together */
				iNext = 0;
				zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
				iBlksz = pPage->nFree;
				zPrev = 0;
				break;
			}else{
				return UNQLITE_FULL;
			}
		}
		/* Point to the next free block */
		zPtr = &pPage->pRaw->zData[iNext];
	}
	/* Acquire writer lock on this page */
	rc = pPage->pHash->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Save block offset */
	*pOfft = (sxu16)(zPtr - pPage->pRaw->zData);
	/* Fix pointers */
	if( iBlksz >= nByte && (iBlksz - nByte) > 3 ){
		unsigned char *zBlock = &pPage->pRaw->zData[(*pOfft) + nByte];
		/* Create a new block */
		zPtr = zBlock;
		SyBigEndianPack16(zBlock,iNext); /* Offset of the next block */
		SyBigEndianPack16(&zBlock[2],iBlksz-nByte); /* Block size*/
		/* Offset of the new block */
		iNext = (sxu16)(zPtr - pPage->pRaw->zData);
		iBlksz = nByte;
	}
	/* Fix offsets */
	if( zPrev ){
		SyBigEndianPack16(zPrev,iNext);
	}else{
		/* First block */
		pPage->sHdr.iFree = iNext;
		/* Reflect on the page header */
		SyBigEndianPack16(&pPage->pRaw->zData[2/* Offset of the first cell1*/],iNext);
	}
	/* All done */
	pPage->nFree -= iBlksz;
	return UNQLITE_OK;
}